

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O2

void SubtractionHelper<short,_unsigned_long,_10>::
     SubtractThrow<safeint_exception_handlers::SafeInt_InvalidParameter>
               (short *lhs,unsigned_long *rhs,short *result)

{
  ushort t;
  uint32_t uVar1;
  ulong uVar2;
  
  t = *lhs;
  uVar2 = *rhs;
  if ((short)t < 0) {
    uVar1 = AbsValueHelper<short,_0>::Abs(t);
    if (uVar2 <= 0x8000 - (ulong)uVar1) {
      t = *lhs;
      uVar2 = *rhs;
      goto LAB_00127de1;
    }
  }
  else if (uVar2 <= ((ulong)t | 0x8000)) {
LAB_00127de1:
    *result = t - (short)uVar2;
    return;
  }
  safeint_exception_handlers::SafeInt_InvalidParameter::SafeIntOnOverflow();
}

Assistant:

SAFEINT_CONSTEXPR14 static void SubtractThrow( const T& lhs, const U& rhs, T& result ) SAFEINT_CPP_THROW
    {
        // lhs is any signed int, rhs unsigned int64
        // check against available range

        // We need the absolute value of std::numeric_limits<T>::min()
        // This will give it to us without extraneous compiler warnings
        SAFEINT_CONSTEXPR11 std::uint64_t AbsMinIntT = (std::uint64_t)std::numeric_limits<T>::max() + 1;

        if( lhs < 0 )
        {
            if( rhs <= AbsMinIntT - AbsValueHelper< T, GetAbsMethod< T >::method >::Abs( lhs ) )
            {
                result = (T)( lhs - rhs );
                return;
            }
        }
        else
        {
            if( rhs <= AbsMinIntT + (std::uint64_t)lhs )
            {
                result = (T)( lhs - rhs );
                return;
            }
        }

        E::SafeIntOnOverflow();
    }